

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.hpp
# Opt level: O3

int __thiscall antlr::InputBuffer::LA(InputBuffer *this,uint i)

{
  (*this->_vptr_InputBuffer[4])();
  return (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start
         [(this->queue).m_offset + (ulong)((this->markerOffset + i) - 1)];
}

Assistant:

virtual inline int LA(unsigned int i)
	{
		fill(i);
		return queue.elementAt(markerOffset + i - 1);
	}